

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

shared_ptr<duckdb::RowVersionManager,_true> __thiscall
duckdb::RowGroup::GetOrCreateVersionInfoInternal(RowGroup *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  idx_t iVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  idx_t *in_RSI;
  RowVersionManager *__tmp;
  RowVersionManager *this_02;
  shared_ptr<duckdb::RowVersionManager,_true> sVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0xb));
  if (iVar2 == 0) {
    this_02 = (RowVersionManager *)in_RSI[6];
    if (this_02 == (RowVersionManager *)0x0) {
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
      this_01->_M_use_count = 1;
      this_01->_M_weak_count = 1;
      this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0197dff0;
      this_02 = (RowVersionManager *)(this_01 + 1);
      RowVersionManager::RowVersionManager(this_02,*in_RSI);
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      in_RSI[6] = (idx_t)this_02;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[7];
      in_RSI[7] = (idx_t)this_01;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        this_02 = (RowVersionManager *)in_RSI[6];
      }
      LOCK();
      in_RSI[5] = (idx_t)this_02;
      UNLOCK();
    }
    (this->super_SegmentBase<duckdb::RowGroup>).start = (idx_t)this_02;
    iVar1 = in_RSI[7];
    (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i =
         iVar1;
    if (iVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(iVar1 + 8) = *(int *)(iVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(iVar1 + 8) = *(int *)(iVar1 + 8) + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0xb));
    sVar3.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar3.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)this;
    return (shared_ptr<duckdb::RowVersionManager,_true>)
           sVar3.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

shared_ptr<RowVersionManager> RowGroup::GetOrCreateVersionInfoInternal() {
	// version info does not exist - need to create it
	lock_guard<mutex> lock(row_group_lock);
	if (!owned_version_info) {
		auto new_info = make_shared_ptr<RowVersionManager>(start);
		SetVersionInfo(std::move(new_info));
	}
	return owned_version_info;
}